

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_chunk_append(uchar **out,size_t *outlength,uchar *chunk)

{
  ulong uVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = *(uint *)chunk;
  uVar5 = (ulong)((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
                 + 0xc);
  uVar1 = *outlength;
  uVar2 = 0x4d;
  if (!CARRY8(uVar1,uVar5)) {
    puVar3 = (uchar *)realloc(*out,uVar1 + uVar5);
    if (puVar3 == (uchar *)0x0) {
      uVar2 = 0x53;
    }
    else {
      *out = puVar3;
      *outlength = uVar1 + uVar5;
      if (uVar5 == 0) {
        uVar2 = 0;
      }
      else {
        puVar3 = *out;
        uVar2 = 0;
        uVar4 = 0;
        do {
          puVar3[uVar4 + uVar1] = chunk[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned lodepng_read32bitInt(const unsigned char* buffer)
{
	return (unsigned)((buffer[0] << 24) | (buffer[1] << 16) | (buffer[2] << 8) | buffer[3]);
}